

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.h
# Opt level: O1

Mat * __thiscall ncnn::Mat::reshape(Mat *__return_storage_ptr__,Mat *this,int _w,int _h)

{
  int iVar1;
  int *piVar2;
  size_t sVar3;
  void *pvVar4;
  void *pvVar5;
  int iVar6;
  long lVar7;
  
  iVar6 = _h * _w;
  if (this->h * this->w * this->c == iVar6) {
    iVar1 = this->dims;
    if ((iVar1 == 3) && (this->cstep != (long)this->h * (long)this->w)) {
      __return_storage_ptr__->h = 0;
      __return_storage_ptr__->c = 0;
      __return_storage_ptr__->cstep = 0;
      __return_storage_ptr__->elemsize = 0;
      __return_storage_ptr__->dims = 0;
      __return_storage_ptr__->w = 0;
      __return_storage_ptr__->data = (void *)0x0;
      __return_storage_ptr__->refcount = (int *)0x0;
      sVar3 = this->elemsize;
      if ((((__return_storage_ptr__->dims != 2) || (__return_storage_ptr__->w != _w)) ||
          (__return_storage_ptr__->h != _h)) || (__return_storage_ptr__->elemsize != sVar3)) {
        piVar2 = __return_storage_ptr__->refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if ((*piVar2 == 0) && (__return_storage_ptr__->data != (void *)0x0)) {
            free(*(void **)((long)__return_storage_ptr__->data + -8));
          }
        }
        __return_storage_ptr__->elemsize = 0;
        __return_storage_ptr__->dims = 0;
        __return_storage_ptr__->w = 0;
        __return_storage_ptr__->h = 0;
        __return_storage_ptr__->c = 0;
        __return_storage_ptr__->cstep = 0;
        __return_storage_ptr__->data = (void *)0x0;
        __return_storage_ptr__->refcount = (int *)0x0;
        __return_storage_ptr__->elemsize = sVar3;
        __return_storage_ptr__->dims = 2;
        __return_storage_ptr__->w = _w;
        __return_storage_ptr__->h = _h;
        __return_storage_ptr__->c = 1;
        __return_storage_ptr__->cstep = (long)iVar6;
        if (iVar6 != 0) {
          lVar7 = sVar3 * (long)iVar6;
          pvVar4 = malloc(lVar7 + 0x1c);
          pvVar5 = (void *)((long)pvVar4 + 0x17U & 0xfffffffffffffff0);
          *(void **)((long)pvVar5 - 8) = pvVar4;
          __return_storage_ptr__->data = pvVar5;
          __return_storage_ptr__->refcount = (int *)((long)pvVar5 + lVar7);
          *(undefined4 *)((long)pvVar5 + lVar7) = 1;
        }
      }
      if (0 < this->c) {
        pvVar4 = __return_storage_ptr__->data;
        lVar7 = 0;
        do {
          sVar3 = this->elemsize;
          iVar6 = this->h * this->w;
          memcpy((void *)((long)((int)lVar7 * iVar6) * sVar3 + (long)pvVar4),
                 (void *)(this->cstep * lVar7 * sVar3 + (long)this->data),(long)iVar6 * sVar3);
          lVar7 = lVar7 + 1;
        } while (lVar7 < this->c);
      }
    }
    else {
      __return_storage_ptr__->data = this->data;
      piVar2 = this->refcount;
      __return_storage_ptr__->refcount = piVar2;
      __return_storage_ptr__->elemsize = this->elemsize;
      __return_storage_ptr__->dims = iVar1;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      iVar1 = this->h;
      __return_storage_ptr__->w = this->w;
      __return_storage_ptr__->h = iVar1;
      __return_storage_ptr__->dims = 2;
      __return_storage_ptr__->w = _w;
      __return_storage_ptr__->h = _h;
      __return_storage_ptr__->c = 1;
      __return_storage_ptr__->cstep = (long)iVar6;
    }
  }
  else {
    __return_storage_ptr__->h = 0;
    __return_storage_ptr__->c = 0;
    __return_storage_ptr__->cstep = 0;
    __return_storage_ptr__->elemsize = 0;
    __return_storage_ptr__->dims = 0;
    __return_storage_ptr__->w = 0;
    __return_storage_ptr__->data = (void *)0x0;
    __return_storage_ptr__->refcount = (int *)0x0;
  }
  return __return_storage_ptr__;
}

Assistant:

inline Mat Mat::reshape(int _w, int _h) const
{
    if (w * h * c != _w * _h)
        return Mat();

    if (dims == 3 && cstep != (size_t)w * h)
    {
        Mat m;
        m.create(_w, _h, elemsize);

        // flatten
        for (int i=0; i<c; i++)
        {
            const void* ptr = (unsigned char*)data + i * cstep * elemsize;
            void* mptr = (unsigned char*)m.data + i * w * h * elemsize;
            memcpy(mptr, ptr, w * h * elemsize);
        }

        return m;
    }

    Mat m = *this;

    m.dims = 2;
    m.w = _w;
    m.h = _h;
    m.c = 1;

    m.cstep = _w * _h;

    return m;
}